

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::TableFill::finalize(TableFill *this)

{
  bool bVar1;
  bool local_31;
  Type local_30;
  Type local_28;
  BasicType local_1c [3];
  TableFill *local_10;
  TableFill *this_local;
  
  local_1c[2] = 1;
  local_10 = this;
  bVar1 = wasm::Type::operator==(&this->dest->type,local_1c + 2);
  local_31 = true;
  if (!bVar1) {
    local_1c[1] = 1;
    bVar1 = wasm::Type::operator==(&this->value->type,local_1c + 1);
    local_31 = true;
    if (!bVar1) {
      local_1c[0] = unreachable;
      local_31 = wasm::Type::operator==(&this->size->type,local_1c);
    }
  }
  if (local_31 == false) {
    wasm::Type::Type(&local_30,none);
    (this->super_SpecificExpression<(wasm::Expression::Id)49>).super_Expression.type.id =
         local_30.id;
  }
  else {
    wasm::Type::Type(&local_28,unreachable);
    (this->super_SpecificExpression<(wasm::Expression::Id)49>).super_Expression.type.id =
         local_28.id;
  }
  return;
}

Assistant:

void TableFill::finalize() {
  if (dest->type == Type::unreachable || value->type == Type::unreachable ||
      size->type == Type::unreachable) {
    type = Type::unreachable;
  } else {
    type = Type::none;
  }
}